

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

fxp_handle * fxp_got_handle(sftp_packet *pktin)

{
  fxp_handle *pfVar1;
  char *pcVar2;
  ptrlen pl;
  
  pl = BinarySource_get_string(pktin->binarysource_);
  if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
    pfVar1 = (fxp_handle *)safemalloc(1,0x10,0);
    pcVar2 = mkstr(pl);
    pfVar1->hstring = pcVar2;
    pfVar1->hlen = (int)pl.len;
  }
  else {
    fxp_error_message = "received malformed FXP_HANDLE";
    fxp_errtype = -1;
    pfVar1 = (fxp_handle *)0x0;
  }
  sftp_pkt_free(pktin);
  return pfVar1;
}

Assistant:

static struct fxp_handle *fxp_got_handle(struct sftp_packet *pktin)
{
    ptrlen id;
    struct fxp_handle *handle;

    id = get_string(pktin);
    if (get_err(pktin)) {
        fxp_internal_error("received malformed FXP_HANDLE");
        sftp_pkt_free(pktin);
        return NULL;
    }
    handle = snew(struct fxp_handle);
    handle->hstring = mkstr(id);
    handle->hlen = id.len;
    sftp_pkt_free(pktin);
    return handle;
}